

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O2

void __thiscall DSDcc::DSDDstar::processHD(DSDDstar *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  if (this->m_symbolIndexHD == 0x293) {
    reset_header_strings(this);
    DStarSlowData::init(&this->m_slowData,in_RSI);
    dstar_header_decode(this);
    init(this,(EVP_PKEY_CTX *)0x0);
    this->m_voiceFrameCount = 0x14;
    this->m_frameType = DStarVoiceFrame;
    this->m_dsdDecoder->m_fsmState = DSDprocessDSTAR;
  }
  else {
    this->m_symbolIndexHD = this->m_symbolIndexHD + 1;
  }
  return;
}

Assistant:

void DSDDstar::processHD()
{
    if (m_symbolIndexHD == 660-1)
    {
        reset_header_strings();
        m_slowData.init();
        dstar_header_decode();
        init(); // init for DSTAR
        m_frameType = DStarVoiceFrame; // we start on a voice frame
        m_voiceFrameCount = 20;        // we start at one frame before sync
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDSTAR; // go to DSTAR
    }
    else
    {
        m_symbolIndexHD++;
    }
}